

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  MessageOptions *pMVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar2;
  Type TVar3;
  Descriptor *pDVar4;
  MessageOptions *pMVar5;
  ErrorLocation location;
  string *element_name;
  char *error;
  string local_50;
  
  if (this->pool_->lazily_build_dependencies_ == true) {
    if (field == (FieldDescriptor *)0x0) {
      return;
    }
    pDVar4 = FieldDescriptor::message_type(field);
    if (pDVar4 == (Descriptor *)0x0) {
      return;
    }
  }
  if ((*(char *)(*(long *)(field + 0x78) + 0x4d) == '\x01') &&
     (TVar3 = FieldDescriptor::type(field), TVar3 != TYPE_MESSAGE)) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "[lazy = true] can only be specified for submessage fields.");
  }
  if ((*(char *)(*(long *)(field + 0x78) + 0x4c) == '\x01') &&
     (bVar2 = FieldDescriptor::is_packable(field), !bVar2)) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "[packed = true] can only be specified for repeated primitive fields.");
  }
  if (((*(long *)(field + 0x50) != 0) &&
      (pMVar1 = *(MessageOptions **)(*(long *)(field + 0x50) + 0x20),
      pMVar5 = MessageOptions::default_instance(), pMVar1 != pMVar5)) &&
     (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x48) == '\x01')) {
    if (field[0x42] == (FieldDescriptor)0x1) {
      if ((*(int *)(field + 0x3c) == 1) &&
         (TVar3 = FieldDescriptor::type(field), TVar3 == TYPE_MESSAGE)) goto LAB_002a8773;
      element_name = *(string **)(field + 8);
      error = "Extensions of MessageSets must be optional messages.";
      location = TYPE;
    }
    else {
      element_name = *(string **)(field + 8);
      error = "MessageSets cannot have fields, only extensions.";
      location = NAME;
    }
    AddError(this,element_name,&proto->super_Message,location,error);
  }
LAB_002a8773:
  bVar2 = IsLite(*(FileDescriptor **)(field + 0x28));
  if (((bVar2) && (*(long *)(field + 0x50) != 0)) &&
     (bVar2 = IsLite(*(FileDescriptor **)(*(long *)(field + 0x50) + 0x10)), !bVar2)) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
            );
  }
  bVar2 = FieldDescriptor::is_map(field);
  if ((bVar2) && (bVar2 = ValidateMapEntry(this,field,proto), !bVar2)) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
  }
  ValidateJSType(this,field,proto);
  if ((field[0x42] == (FieldDescriptor)0x1) && (field[0x41] == (FieldDescriptor)0x1)) {
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(field + 0x20);
    anon_unknown_1::ToJsonName(&local_50,*(string **)field);
    bVar2 = std::operator!=(__lhs,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) {
      AddError(this,*(string **)(field + 8),&proto->super_Message,OPTION_NAME,
               "option json_name is not allowed on extension fields.");
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }
  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (caculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // an user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

}